

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_cc79b7::Target::DumpDependencies(Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  cmGlobalGenerator *this_00;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_01;
  Value local_80;
  reference local_58;
  cmTargetDepend *td;
  iterator __end1;
  iterator __begin1;
  TargetDependSet *__range1;
  cmGlobalGenerator *gg;
  Target *this_local;
  Value *dependencies;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  this_00 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  this_01 = &cmGlobalGenerator::GetTargetDirectDepends(this_00,this->GT)->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>;
  __end1 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
           begin(this_01);
  td = (cmTargetDepend *)
       std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                 (this_01);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&td), bVar1) {
    local_58 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end1);
    DumpDependency(&local_80,this,local_58);
    Json::Value::append(__return_storage_ptr__,&local_80);
    Json::Value::~Value(&local_80);
    std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpDependencies()
{
  Json::Value dependencies = Json::arrayValue;
  cmGlobalGenerator* gg = this->GT->GetGlobalGenerator();
  for (cmTargetDepend const& td : gg->GetTargetDirectDepends(this->GT)) {
    dependencies.append(this->DumpDependency(td));
  }
  return dependencies;
}